

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Number luaL_checknumber(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  int in_ESI;
  lua_State *in_RDI;
  TValue tmp;
  cTValue *o;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  lua_State *in_stack_ffffffffffffffd0;
  lua_State *local_10;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  if ((pTVar2->field_2).it < 0xffff0000) {
    local_10 = (lua_State *)pTVar2->u64;
  }
  else if (((pTVar2->field_2).it != 0xfffffffb) ||
          (iVar1 = lj_strscan_num((GCstr *)in_stack_ffffffffffffffd0,
                                  (TValue *)
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
          local_10 = in_stack_ffffffffffffffd0, iVar1 == 0)) {
    lj_err_argt(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  return (lua_Number)local_10;
}

Assistant:

LUALIB_API lua_Number luaL_checknumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (!(tvisstr(o) && lj_strscan_num(strV(o), &tmp)))
    lj_err_argt(L, idx, LUA_TNUMBER);
  return numV(&tmp);
}